

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryBone(AssbinExport *this,IOStream *container,aiBone *b)

{
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiBone *b_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)b;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x123a,0x1000);
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x404));
  Write<aiMatrix4x4t<float>>((IOStream *)local_58,(aiMatrix4x4 *)(chunk.initial + 0x410));
  if ((this->shortened & 1U) == 0) {
    WriteArray<aiVertexWeight>
              ((IOStream *)local_58,*(aiVertexWeight **)(chunk.initial + 0x408),
               *(uint *)(chunk.initial + 0x404));
  }
  else {
    WriteBounds<aiVertexWeight>
              ((IOStream *)local_58,*(aiVertexWeight **)(chunk.initial + 0x408),
               *(uint *)(chunk.initial + 0x404));
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryBone(IOStream * container, const aiBone* b)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIBONE );

        Write<aiString>(&chunk,b->mName);
        Write<unsigned int>(&chunk,b->mNumWeights);
        Write<aiMatrix4x4>(&chunk,b->mOffsetMatrix);

        // for the moment we write dumb min/max values for the bones, too.
        // maybe I'll add a better, hash-like solution later
        if (shortened) {
            WriteBounds(&chunk,b->mWeights,b->mNumWeights);
        } // else write as usual
        else WriteArray<aiVertexWeight>(&chunk,b->mWeights,b->mNumWeights);
    }